

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O3

void __thiscall
google::protobuf::DescriptorBuilder::OptionInterpreter::OptionInterpreter
          (OptionInterpreter *this,DescriptorBuilder *builder)

{
  _Rb_tree_header *p_Var1;
  LogMessage *other;
  LogFinisher local_51;
  LogMessage local_50;
  
  this->builder_ = builder;
  p_Var1 = &(this->interpreted_paths_)._M_t._M_impl.super__Rb_tree_header;
  (this->interpreted_paths_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->interpreted_paths_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0
  ;
  (this->interpreted_paths_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->interpreted_paths_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->interpreted_paths_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->repeated_option_counts_)._M_t._M_impl.super__Rb_tree_header;
  (this->repeated_option_counts_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->repeated_option_counts_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->repeated_option_counts_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->repeated_option_counts_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->repeated_option_counts_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  DynamicMessageFactory::DynamicMessageFactory(&this->dynamic_factory_);
  if (this->builder_ == (DescriptorBuilder *)0x0) {
    internal::LogMessage::LogMessage
              (&local_50,LOGLEVEL_FATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/protobuf/src/google/protobuf/descriptor.cc"
               ,0x186a);
    other = internal::LogMessage::operator<<(&local_50,"CHECK failed: builder_: ");
    internal::LogFinisher::operator=(&local_51,other);
    internal::LogMessage::~LogMessage(&local_50);
  }
  return;
}

Assistant:

DescriptorBuilder::OptionInterpreter::OptionInterpreter(
    DescriptorBuilder* builder)
    : builder_(builder) {
  GOOGLE_CHECK(builder_);
}